

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O2

bool __thiscall
boost::unit_test::utils::
basic_string_token_iterator<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
get(basic_string_token_iterator<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
    *this)

{
  bool bVar1;
  iterator begin;
  iterator local_18;
  
  local_18 = (this->m_src).m_begin;
  bVar1 = token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
          ::get<char_const*>((token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
                              *)this,&local_18,(this->m_src).m_end);
  (this->m_src).m_begin = local_18;
  return bVar1;
}

Assistant:

bool        get()
    {
        typename cstring::iterator begin = m_src.begin();
        bool res = base::get( begin, m_src.end() );

        m_src.assign( begin, m_src.end() );

        return res;
    }